

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

int clickhouse::SocketConnect
              (NetworkAddress *addr,optional<clickhouse::SocketTimeoutParams> *socket_timeout_params
              )

{
  SocketTimeoutParams params;
  bool bVar1;
  int iVar2;
  SocketTimeoutParams *pSVar3;
  int *piVar4;
  ssize_t sVar5;
  undefined8 uVar6;
  system_error *this;
  NetworkAddress *in_RDI;
  socklen_t len;
  ssize_t rval;
  pollfd fd;
  int err;
  int s;
  addrinfo *res;
  int last_err;
  __time_t in_stack_ffffffffffffff18;
  pollfd *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  error_category *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff3c;
  system_error *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  socklen_t in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int local_54;
  __time_t local_50;
  pollfd *local_48;
  char *local_40;
  error_category *local_38;
  int local_2c;
  addrinfo *local_28;
  int local_1c;
  
  local_1c = 0;
  local_28 = NetworkAddress::Info(in_RDI);
  do {
    if (local_28 == (addrinfo *)0x0) {
      if (0 < local_1c) {
        uVar6 = __cxa_allocate_exception(0x20);
        std::_V2::system_category();
        std::system_error::system_error
                  (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff30,
                   in_stack_ffffffffffffff28);
        __cxa_throw(uVar6,&std::system_error::typeinfo,std::system_error::~system_error);
      }
      this = (system_error *)__cxa_allocate_exception(0x20);
      __errno_location();
      std::_V2::system_category();
      std::system_error::system_error
                (this,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28)
      ;
      __cxa_throw(this,&std::system_error::typeinfo,std::system_error::~system_error);
    }
    local_2c = socket(local_28->ai_family,local_28->ai_socktype,local_28->ai_protocol);
    if (local_2c != -1) {
      anon_unknown_4::SetNonBlock
                ((int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                 SUB81((ulong)in_stack_ffffffffffffff40 >> 0x18,0));
      bVar1 = std::optional::operator_cast_to_bool
                        ((optional<clickhouse::SocketTimeoutParams> *)0x1e8490);
      if (bVar1) {
        iVar2 = local_2c;
        pSVar3 = std::optional<clickhouse::SocketTimeoutParams>::operator*
                           ((optional<clickhouse::SocketTimeoutParams> *)0x1e84ae);
        in_stack_ffffffffffffff18 = (pSVar3->recv_timeout_).tv_sec;
        in_stack_ffffffffffffff20 = (pollfd *)(pSVar3->recv_timeout_).tv_usec;
        in_stack_ffffffffffffff28 = (char *)(pSVar3->send_timeout_).tv_sec;
        in_stack_ffffffffffffff30 = (error_category *)(pSVar3->send_timeout_).tv_usec;
        params.recv_timeout_.tv_usec = in_stack_ffffffffffffff78;
        params.recv_timeout_.tv_sec = in_stack_ffffffffffffff70;
        params.send_timeout_.tv_sec._0_4_ = in_stack_ffffffffffffff80;
        params.send_timeout_.tv_sec._4_4_ = iVar2;
        params.send_timeout_.tv_usec._0_4_ = in_stack_ffffffffffffff88;
        params.send_timeout_.tv_usec._4_4_ = in_stack_ffffffffffffff8c;
        local_50 = in_stack_ffffffffffffff18;
        local_48 = in_stack_ffffffffffffff20;
        local_40 = in_stack_ffffffffffffff28;
        local_38 = in_stack_ffffffffffffff30;
        anon_unknown_4::SetTimeout((int)((ulong)in_stack_ffffffffffffff60 >> 0x20),params);
      }
      iVar2 = connect(local_2c,(sockaddr *)local_28->ai_addr,local_28->ai_addrlen);
      if (iVar2 == 0) {
        anon_unknown_4::SetNonBlock
                  ((int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                   SUB81((ulong)in_stack_ffffffffffffff40 >> 0x18,0));
        return local_2c;
      }
      piVar4 = __errno_location();
      local_54 = *piVar4;
      if (((local_54 == 0x73) || (local_54 == 0xb)) || (local_54 == 0xb)) {
        sVar5 = Poll(in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                     (int)in_stack_ffffffffffffff18);
        if (sVar5 == -1) {
          uVar6 = __cxa_allocate_exception(0x20);
          __errno_location();
          std::_V2::system_category();
          std::system_error::system_error
                    (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff30,
                     in_stack_ffffffffffffff28);
          __cxa_throw(uVar6,&std::system_error::typeinfo,std::system_error::~system_error);
        }
        if (0 < sVar5) {
          in_stack_ffffffffffffff88 = 4;
          getsockopt(local_2c,1,4,&local_54,(socklen_t *)&stack0xffffffffffffff88);
          if (local_54 == 0) {
            anon_unknown_4::SetNonBlock
                      ((int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                       SUB81((ulong)in_stack_ffffffffffffff40 >> 0x18,0));
            return local_2c;
          }
          local_1c = local_54;
        }
      }
    }
    local_28 = local_28->ai_next;
  } while( true );
}

Assistant:

SOCKET SocketConnect(const NetworkAddress& addr, const std::optional<SocketTimeoutParams>& socket_timeout_params) {
    int last_err = 0;
    for (auto res = addr.Info(); res != nullptr; res = res->ai_next) {
        SOCKET s(socket(res->ai_family, res->ai_socktype, res->ai_protocol));

        if (s == -1) {
            continue;
        }

        SetNonBlock(s, true);
        if(socket_timeout_params) {
            SetTimeout(s, *socket_timeout_params);
        }

        if (connect(s, res->ai_addr, (int)res->ai_addrlen) != 0) {
            int err = errno;
            if (err == EINPROGRESS || err == EAGAIN || err == EWOULDBLOCK) {
                pollfd fd;
                fd.fd = s;
                fd.events = POLLOUT;
                fd.revents = 0;
                ssize_t rval = Poll(&fd, 1, 5000);

                if (rval == -1) {
                    throw std::system_error(errno, std::system_category(), "fail to connect");
                }
                if (rval > 0) {
                    socklen_t len = sizeof(err);
                    getsockopt(s, SOL_SOCKET, SO_ERROR, (char*)&err, &len);

                    if (!err) {
                        SetNonBlock(s, false);
                        return s;
                    }
                   last_err = err;
                }
            }
        } else {
            SetNonBlock(s, false);
            return s;
        }
    }
    if (last_err > 0) {
        throw std::system_error(last_err, std::system_category(), "fail to connect");
    }
    throw std::system_error(
        errno, std::system_category(), "fail to connect"
    );
}